

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O0

int Sbm_ManCheckSol(Sbm_Man_t *p,Vec_Int_t *vSol)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *vCut;
  int RetValue;
  int Cut;
  int Lit;
  int j;
  int i;
  Vec_Int_t *vSol_local;
  Sbm_Man_t *p_local;
  
  vCut._4_4_ = 1;
  Vec_IntClear(p->vPolar);
  pVVar5 = p->vLit2Used;
  iVar1 = Vec_WecSize(p->vObjCuts);
  Vec_IntFill(pVVar5,iVar1 + p->nInputs,0);
  for (Lit = 0; iVar1 = Vec_IntSize(p->vSolCuts), Lit < iVar1; Lit = Lit + 1) {
    iVar1 = Vec_IntEntry(p->vSolCuts,Lit);
    if (iVar1 < 0) {
      Vec_IntWriteEntry(p->vLit2Used,-iVar1,1);
      Vec_IntPush(p->vPolar,-iVar1);
    }
    else {
      Vec_IntPush(p->vPolar,p->FirstVar + iVar1);
      pVVar5 = Vec_WecEntry(p->vCuts,iVar1);
      iVar1 = Vec_IntEntry(pVVar5,0);
      iVar1 = iVar1 - p->LitShift;
      iVar3 = Vec_IntEntry(p->vLit2Used,iVar1);
      if (iVar3 == 0) {
        Vec_IntWriteEntry(p->vLit2Used,iVar1,1);
        Vec_IntPush(p->vPolar,iVar1);
      }
    }
  }
  for (Lit = 0; iVar1 = Vec_IntSize(p->vRoots), Lit < iVar1; Lit = Lit + 1) {
    uVar2 = Vec_IntEntry(p->vRoots,Lit);
    iVar1 = Vec_IntEntry(p->vLit2Used,uVar2);
    if (iVar1 == 0) {
      printf("Output literal %d has no cut.\n",(ulong)uVar2);
      vCut._4_4_ = 0;
    }
  }
  Lit = 0;
  do {
    iVar1 = Vec_IntSize(p->vSolCuts);
    if (iVar1 <= Lit) {
      return vCut._4_4_;
    }
    uVar2 = Vec_IntEntry(p->vSolCuts,Lit);
    if (-1 < (int)uVar2) {
      pVVar5 = Vec_WecEntry(p->vCuts,uVar2);
      for (Cut = 1; iVar1 = Vec_IntSize(pVVar5), Cut < iVar1; Cut = Cut + 1) {
        iVar1 = Vec_IntEntry(pVVar5,Cut);
        if (iVar1 - p->LitShift < 0) {
          iVar3 = Abc_LitIsCompl(iVar1);
          if (iVar3 == 0) {
            __assert_fail("Abc_LitIsCompl(Lit)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatMap.c"
                          ,0x7e,"int Sbm_ManCheckSol(Sbm_Man_t *, Vec_Int_t *)");
          }
          p_00 = p->vLit2Used;
          iVar3 = Vec_WecSize(p->vObjCuts);
          iVar4 = Abc_Lit2Var(iVar1);
          iVar3 = Vec_IntEntry(p_00,iVar3 + iVar4 + -1);
          if (iVar3 == 0) {
            iVar1 = Abc_Lit2Var(iVar1);
            printf("Inverter of input %d of cut %d is not mapped.\n",(ulong)(iVar1 - 1),(ulong)uVar2
                  );
            vCut._4_4_ = 0;
          }
        }
        else {
          iVar3 = Vec_IntEntry(p->vLit2Used,iVar1 - p->LitShift);
          if (iVar3 == 0) {
            printf("Internal literal %d of cut %d is not mapped.\n",
                   (ulong)(uint)(iVar1 - p->LitShift),(ulong)uVar2);
            vCut._4_4_ = 0;
          }
        }
      }
      Vec_IntPush(p->vPolar,p->FirstVar + uVar2);
    }
    Lit = Lit + 1;
  } while( true );
}

Assistant:

int Sbm_ManCheckSol( Sbm_Man_t * p, Vec_Int_t * vSol )
{
    //int K = Vec_IntSize(vSol) - 1;
    int i, j, Lit, Cut;
    int RetValue = 1;
    Vec_Int_t * vCut;
    // clear polarity and assumptions
    Vec_IntClear( p->vPolar );
    // mark used literals
    Vec_IntFill( p->vLit2Used, Vec_WecSize(p->vObjCuts) + p->nInputs, 0 );
    Vec_IntForEachEntry( p->vSolCuts, Cut, i )
    {
        if ( Cut < 0 ) // input inverter variable
        {
            Vec_IntWriteEntry( p->vLit2Used, -Cut, 1 );
            Vec_IntPush( p->vPolar, -Cut ); 
            continue;
        }
        Vec_IntPush( p->vPolar, p->FirstVar + Cut ); 
        vCut = Vec_WecEntry( p->vCuts, Cut );
        Lit = Vec_IntEntry( vCut, 0 ) - p->LitShift; // obj literal
        if ( Vec_IntEntry(p->vLit2Used, Lit) )
            continue;
        Vec_IntWriteEntry( p->vLit2Used, Lit, 1 );
        Vec_IntPush( p->vPolar, Lit ); // literal variable
    }
    // check that the output literals are used
    Vec_IntForEachEntry( p->vRoots, Lit, i )
    {
        if ( Vec_IntEntry(p->vLit2Used, Lit) == 0 )
            printf( "Output literal %d has no cut.\n", Lit ), RetValue = 0;
    }
    // check internal nodes
    Vec_IntForEachEntry( p->vSolCuts, Cut, i )
    {
        if ( Cut < 0 )
            continue;
        vCut = Vec_WecEntry( p->vCuts, Cut );
        Vec_IntForEachEntryStart( vCut, Lit, j, 1 )
            if ( Lit - p->LitShift < 0 )
            {
                assert( Abc_LitIsCompl(Lit) );
                if ( Vec_IntEntry(p->vLit2Used, Vec_WecSize(p->vObjCuts) + Abc_Lit2Var(Lit)-1) == 0 )
                    printf( "Inverter of input %d of cut %d is not mapped.\n", Abc_Lit2Var(Lit)-1, Cut ), RetValue = 0;
            }
            else if ( Vec_IntEntry(p->vLit2Used, Lit - p->LitShift) == 0 )
                printf( "Internal literal %d of cut %d is not mapped.\n", Lit - p->LitShift, Cut ), RetValue = 0;
        // create polarity
        Vec_IntPush( p->vPolar, p->FirstVar + Cut ); // cut variable
    }
    return RetValue;
}